

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::GenerateImportPrefix(cmExportInstallFileGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmInstallExportGenerator *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  long *plVar8;
  size_type *psVar9;
  string absDest;
  string absDestS;
  string dest;
  string installPrefix;
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  this_00 = this->IEGen->LocalGenerator->Makefile;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_INSTALL_PREFIX","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,&local_d0);
  std::__cxx11::string::string((string *)&local_70,pcVar6,(allocator *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->IEGen;
  bVar4 = cmsys::SystemTools::FileIsFullPath(&(pcVar2->super_cmInstallGenerator).Destination);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"# The installation prefix configured by this project.\nset(_IMPORT_PREFIX \"",
               0x4a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n\n",4);
    goto LAB_0045e1dc;
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_70,(long)local_70 + local_68);
  std::__cxx11::string::append((char *)local_b0);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_b0,
                              (ulong)(pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p
                             );
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  std::__cxx11::string::append((char *)local_b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# Compute the installation prefix relative to this file.\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"get_filename_component(_IMPORT_PREFIX",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            (os," \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n",0x24);
  plVar8 = local_b0[0];
  iVar5 = strncmp((char *)local_b0[0],"/lib/",5);
  if (iVar5 == 0) {
LAB_0045e04d:
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "# Use original install prefix when loaded through a\n# cross-prefix symbolic link such as /lib -> /usr/lib.\nget_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\nget_filename_component(_realOrig \""
               ,0xcc);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\" REALPATH)\nif(_realCurr STREQUAL _realOrig)\n  set(_IMPORT_PREFIX \"",0x43
              );
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\")\nendif()\nunset(_realOrig)\nunset(_realCurr)\n",0x2d);
  }
  else {
    iVar5 = strncmp((char *)plVar8,"/lib64/",7);
    if (iVar5 == 0) goto LAB_0045e04d;
    iVar5 = strncmp((char *)plVar8,"/libx32/",8);
    if (iVar5 == 0) goto LAB_0045e04d;
    iVar5 = strncmp((char *)plVar8,"/usr/lib/",9);
    if (iVar5 == 0) goto LAB_0045e04d;
    iVar5 = strncmp((char *)plVar8,"/usr/lib64/",0xb);
    if (iVar5 == 0) goto LAB_0045e04d;
    iVar5 = strncmp((char *)plVar8,"/usr/libx32/",0xc);
    if (iVar5 == 0) goto LAB_0045e04d;
  }
  pcVar3 = (pcVar2->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,
             pcVar3 + (pcVar2->super_cmInstallGenerator).Destination._M_string_length);
  if (local_90._M_string_length != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" PATH)\n",0x40);
      cmsys::SystemTools::GetFilenamePath(&local_50,&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (local_90._M_string_length != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(_IMPORT_PREFIX STREQUAL \"/\")\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>(os,"  set(_IMPORT_PREFIX \"\")\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
LAB_0045e1dc:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportPrefix(std::ostream& os)
{
  // Set an _IMPORT_PREFIX variable for import location properties
  // to reference if they are relative to the install prefix.
  std::string installPrefix =
    this->IEGen->GetLocalGenerator()->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_PREFIX");
  std::string const& expDest = this->IEGen->GetDestination();
  if (cmSystemTools::FileIsFullPath(expDest)) {
    // The export file is being installed to an absolute path so the
    // package is not relocatable.  Use the configured install prefix.
    /* clang-format off */
    os <<
      "# The installation prefix configured by this project.\n"
      "set(_IMPORT_PREFIX \"" << installPrefix << "\")\n"
      "\n";
    /* clang-format on */
  } else {
    // Add code to compute the installation prefix relative to the
    // import file location.
    std::string absDest = installPrefix + "/" + expDest;
    std::string absDestS = absDest + "/";
    os << "# Compute the installation prefix relative to this file.\n"
       << "get_filename_component(_IMPORT_PREFIX"
       << " \"${CMAKE_CURRENT_LIST_FILE}\" PATH)\n";
    if (cmHasLiteralPrefix(absDestS.c_str(), "/lib/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/lib64/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/libx32/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/lib64/") ||
        cmHasLiteralPrefix(absDestS.c_str(), "/usr/libx32/")) {
      // Handle "/usr move" symlinks created by some Linux distros.
      /* clang-format off */
      os <<
        "# Use original install prefix when loaded through a\n"
        "# cross-prefix symbolic link such as /lib -> /usr/lib.\n"
        "get_filename_component(_realCurr \"${_IMPORT_PREFIX}\" REALPATH)\n"
        "get_filename_component(_realOrig \"" << absDest << "\" REALPATH)\n"
        "if(_realCurr STREQUAL _realOrig)\n"
        "  set(_IMPORT_PREFIX \"" << absDest << "\")\n"
        "endif()\n"
        "unset(_realOrig)\n"
        "unset(_realCurr)\n";
      /* clang-format on */
    }
    std::string dest = expDest;
    while (!dest.empty()) {
      os << "get_filename_component(_IMPORT_PREFIX \"${_IMPORT_PREFIX}\" "
            "PATH)\n";
      dest = cmSystemTools::GetFilenamePath(dest);
    }
    os << "if(_IMPORT_PREFIX STREQUAL \"/\")\n"
       << "  set(_IMPORT_PREFIX \"\")\n"
       << "endif()\n"
       << "\n";
  }
}